

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nodebuilder.cpp
# Opt level: O3

node * __thiscall YAML::NodeBuilder::Push(NodeBuilder *this,Mark *mark,anchor_t anchor)

{
  node *node;
  
  node = detail::memory::create_node
                   ((((this->m_pMemory).
                      super___shared_ptr<YAML::detail::memory_holder,_(__gnu_cxx::_Lock_policy)2>.
                     _M_ptr)->m_pMemory).
                    super___shared_ptr<YAML::detail::memory,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
  detail::node_data::set_mark
            ((((node->m_pRef).super___shared_ptr<YAML::detail::node_ref,_(__gnu_cxx::_Lock_policy)2>
              ._M_ptr)->m_pData).
             super___shared_ptr<YAML::detail::node_data,_(__gnu_cxx::_Lock_policy)2>._M_ptr,mark);
  RegisterAnchor(this,anchor,node);
  Push(this,node);
  return node;
}

Assistant:

detail::node& NodeBuilder::Push(const Mark& mark, anchor_t anchor) {
  detail::node& node = m_pMemory->create_node();
  node.set_mark(mark);
  RegisterAnchor(anchor, node);
  Push(node);
  return node;
}